

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copyCCtx_internal
                 (ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,ZSTD_frameParameters fParams,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ZSTD_CCtx_params params_00;
  U32 UVar7;
  size_t sVar8;
  undefined8 uVar9;
  long local_110;
  ZSTD_matchState_t *dstMatchState;
  ZSTD_matchState_t *srcMatchState;
  size_t tableSpace;
  size_t h3Size;
  size_t hSize;
  size_t chainSize;
  ZSTD_CCtx_params params;
  ZSTD_buffered_policy_e zbuff_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx *srcCCtx_local;
  ZSTD_CCtx *dstCCtx_local;
  ZSTD_frameParameters fParams_local;
  
  uVar9 = fParams._0_8_;
  if (srcCCtx->stage == ZSTDcs_init) {
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    params.customMem.opaque._4_4_ = zbuff;
    memcpy(&chainSize,&dstCCtx->requestedParams,0x80);
    uVar1 = (srcCCtx->appliedParams).cParams.windowLog;
    uVar4 = (srcCCtx->appliedParams).cParams.chainLog;
    uVar2 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar5 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar3 = (srcCCtx->appliedParams).cParams.minMatch;
    uVar6 = (srcCCtx->appliedParams).cParams.targetLength;
    params.cParams.minMatch = (srcCCtx->appliedParams).cParams.strategy;
    params_00.cParams.windowLog = uVar1;
    params_00.format = (undefined4)chainSize;
    params_00.cParams.hashLog = uVar2;
    params_00.cParams.chainLog = uVar4;
    params_00.cParams.minMatch = uVar3;
    params_00.cParams.searchLog = uVar5;
    params_00.cParams.strategy = params.cParams.minMatch;
    params_00.cParams.targetLength = uVar6;
    params_00.compressionLevel = params.fParams.checksumFlag;
    params_00.fParams.noDictIDFlag = fParams.noDictIDFlag;
    params_00.fParams.contentSizeFlag = (uint)uVar9;
    params_00.fParams.checksumFlag = SUB84(uVar9,4);
    params_00.forceWindow = params.fParams.noDictIDFlag;
    params_00.attachDictPref = params.compressionLevel;
    params_00.nbWorkers = params.forceWindow;
    params_00._60_4_ = params.attachDictPref;
    params_00.jobSize = params._56_8_;
    params_00.overlapLog = (undefined4)params.jobSize;
    params_00.rsyncable = params.jobSize._4_4_;
    params_00.ldmParams.enableLdm = params.overlapLog;
    params_00.ldmParams.hashLog = params.rsyncable;
    params_00.ldmParams.bucketSizeLog = params.ldmParams.enableLdm;
    params_00.ldmParams.minMatchLength = params.ldmParams.hashLog;
    params_00.ldmParams.hashRateLog = params.ldmParams.bucketSizeLog;
    params_00.ldmParams.windowLog = params.ldmParams.minMatchLength;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)params.ldmParams._16_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)params.customMem.customAlloc;
    params_00.customMem.opaque = params.customMem.customFree;
    chainSize._4_4_ = uVar1;
    params.format = uVar4;
    params.cParams.windowLog = uVar2;
    params.cParams.chainLog = uVar5;
    params.cParams.hashLog = uVar3;
    params.cParams.searchLog = uVar6;
    params.cParams._20_8_ = uVar9;
    params.fParams.contentSizeFlag = fParams.noDictIDFlag;
    ZSTD_resetCCtx_internal
              (dstCCtx,params_00,pledgedSrcSize,ZSTDcrp_noMemset,params.customMem.opaque._4_4_);
    if ((srcCCtx->appliedParams).cParams.strategy == ZSTD_fast) {
      local_110 = 0;
    }
    else {
      local_110 = 1L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
    }
    memcpy((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable,
           (local_110 + (1L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f)) +
           (1L << ((byte)(srcCCtx->blockState).matchState.hashLog3 & 0x3f))) * 4);
    (dstCCtx->blockState).matchState.window.nextSrc =
         (srcCCtx->blockState).matchState.window.nextSrc;
    (dstCCtx->blockState).matchState.window.base = (srcCCtx->blockState).matchState.window.base;
    (dstCCtx->blockState).matchState.window.dictBase =
         (srcCCtx->blockState).matchState.window.dictBase;
    UVar7 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.dictLimit =
         (srcCCtx->blockState).matchState.window.dictLimit;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar7;
    (dstCCtx->blockState).matchState.nextToUpdate = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.nextToUpdate3 = (srcCCtx->blockState).matchState.nextToUpdate3;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    dstCCtx->dictID = srcCCtx->dictID;
    memcpy((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x11f0);
    fParams_local.checksumFlag = 0;
    fParams_local.noDictIDFlag = 0;
  }
  else {
    fParams_local.checksumFlag = -0x3c;
    fParams_local.noDictIDFlag = -1;
  }
  sVar8._0_4_ = fParams_local.checksumFlag;
  sVar8._4_4_ = fParams_local.noDictIDFlag;
  return sVar8;
}

Assistant:

static size_t ZSTD_copyCCtx_internal(ZSTD_CCtx* dstCCtx,
                            const ZSTD_CCtx* srcCCtx,
                            ZSTD_frameParameters fParams,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(5, "ZSTD_copyCCtx_internal");
    if (srcCCtx->stage!=ZSTDcs_init) return ERROR(stage_wrong);

    memcpy(&dstCCtx->customMem, &srcCCtx->customMem, sizeof(ZSTD_customMem));
    {   ZSTD_CCtx_params params = dstCCtx->requestedParams;
        /* Copy only compression parameters related to tables. */
        params.cParams = srcCCtx->appliedParams.cParams;
        params.fParams = fParams;
        ZSTD_resetCCtx_internal(dstCCtx, params, pledgedSrcSize,
                                ZSTDcrp_noMemset, zbuff);
        assert(dstCCtx->appliedParams.cParams.windowLog == srcCCtx->appliedParams.cParams.windowLog);
        assert(dstCCtx->appliedParams.cParams.strategy == srcCCtx->appliedParams.cParams.strategy);
        assert(dstCCtx->appliedParams.cParams.hashLog == srcCCtx->appliedParams.cParams.hashLog);
        assert(dstCCtx->appliedParams.cParams.chainLog == srcCCtx->appliedParams.cParams.chainLog);
        assert(dstCCtx->blockState.matchState.hashLog3 == srcCCtx->blockState.matchState.hashLog3);
    }

    /* copy tables */
    {   size_t const chainSize = (srcCCtx->appliedParams.cParams.strategy == ZSTD_fast) ? 0 : ((size_t)1 << srcCCtx->appliedParams.cParams.chainLog);
        size_t const hSize =  (size_t)1 << srcCCtx->appliedParams.cParams.hashLog;
        size_t const h3Size = (size_t)1 << srcCCtx->blockState.matchState.hashLog3;
        size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);
        assert((U32*)dstCCtx->blockState.matchState.chainTable == (U32*)dstCCtx->blockState.matchState.hashTable + hSize);  /* chainTable must follow hashTable */
        assert((U32*)dstCCtx->blockState.matchState.hashTable3 == (U32*)dstCCtx->blockState.matchState.chainTable + chainSize);
        memcpy(dstCCtx->blockState.matchState.hashTable, srcCCtx->blockState.matchState.hashTable, tableSpace);   /* presumes all tables follow each other */
    }

    /* copy dictionary offsets */
    {
        const ZSTD_matchState_t* srcMatchState = &srcCCtx->blockState.matchState;
        ZSTD_matchState_t* dstMatchState = &dstCCtx->blockState.matchState;
        dstMatchState->window       = srcMatchState->window;
        dstMatchState->nextToUpdate = srcMatchState->nextToUpdate;
        dstMatchState->nextToUpdate3= srcMatchState->nextToUpdate3;
        dstMatchState->loadedDictEnd= srcMatchState->loadedDictEnd;
    }
    dstCCtx->dictID = srcCCtx->dictID;

    /* copy block state */
    memcpy(dstCCtx->blockState.prevCBlock, srcCCtx->blockState.prevCBlock, sizeof(*srcCCtx->blockState.prevCBlock));

    return 0;
}